

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O3

void rr::anon_unknown_19::convertPrimitiveToBaseType
               (vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *output,
               vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_> *input)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  pointer pTVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  pointer pTVar8;
  
  std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>::resize
            (output,((long)(input->
                           super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(input->
                           super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
  pTVar8 = (input->
           super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((input->
      super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>).
      _M_impl.super__Vector_impl_data._M_finish != pTVar8) {
    lVar5 = 0x30;
    lVar6 = 0x18;
    uVar7 = 0;
    do {
      iVar1 = *(int *)((long)&pTVar8->v0 + lVar5);
      uVar2 = *(undefined8 *)((long)pTVar8 + lVar5 + -0x20);
      uVar3 = *(undefined8 *)((long)pTVar8 + lVar5 + -0x10);
      pTVar4 = (output->super__Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>).
               _M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((long)pTVar4 + lVar6 + -0x18) = *(undefined8 *)((long)pTVar8 + lVar5 + -0x30);
      *(undefined8 *)((long)pTVar4 + lVar6 + -0x10) = uVar2;
      *(undefined8 *)((long)pTVar4 + lVar6 + -8) = uVar3;
      *(int *)((long)&pTVar4->v0 + lVar6) = iVar1 / 2;
      uVar7 = uVar7 + 1;
      pTVar8 = (input->
               super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x38;
      lVar6 = lVar6 + 0x20;
    } while (uVar7 < (ulong)(((long)(input->
                                    super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar8 >> 3)
                            * 0x6db6db6db6db6db7));
  }
  return;
}

Assistant:

void convertPrimitiveToBaseType(std::vector<pa::Triangle>& output, std::vector<pa::TriangleAdjacency>& input)
{
	output.resize(input.size());
	for (size_t i = 0; i < input.size(); ++i)
	{
		const int adjacentProvokingVertex	= input[i].provokingIndex;
		const int baseProvokingVertexIndex	= adjacentProvokingVertex/2;
		output[i] = pa::Triangle(input[i].v0, input[i].v2, input[i].v4, baseProvokingVertexIndex);
	}
}